

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cc
# Opt level: O2

ostream * operator<<(ostream *out,Node *node)

{
  ostream *poVar1;
  Node *pNVar2;
  
  pNVar2 = node;
  while (pNVar2 = (Node *)(pNVar2->thesteps).
                          super__List_base<const_Operation_*,_std::allocator<const_Operation_*>_>.
                          _M_impl._M_node.super__List_node_base._M_next, pNVar2 != node) {
    poVar1 = operator<<(out,(Operation *)
                            (pNVar2->thesteps).
                            super__List_base<const_Operation_*,_std::allocator<const_Operation_*>_>.
                            _M_impl._M_node._M_size);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return out;
}

Assistant:

ostream &operator<<(ostream &out, const Node &node)
{
	typedef list<const Operation *>::const_iterator iter;
	const list<const Operation *>&steps = node.steps();
	for (iter ii = steps.begin(); ii != steps.end(); ++ii)
		out << *(*ii) << endl;
	return out;
}